

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O3

File * __thiscall njoy::ENDFtk::tree::Material::file(Material *this,int mf)

{
  mapped_type *pmVar1;
  key_type local_14;
  
  pmVar1 = std::
           map<int,_njoy::ENDFtk::tree::File,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::tree::File>_>_>
           ::at(&this->files_,&local_14);
  return pmVar1;
}

Assistant:

const File& file( int mf ) const {

  try {

    return this->files_.at( mf );
  }
  catch( std::out_of_range& o ) {

    Log::error
      ( "Requested file number (MF) does not"
        " correspond to a stored file syntax tree" );
    Log::info( "Requested file number: {}", mf );
    Log::info( "Material number of queried material syntax tree: ",
               this->materialNumber() );
    throw o;
  }
}